

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall correctness_string_conv_Test::TestBody(correctness_string_conv_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  AssertHelper *this_00;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  big_integer *in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  char *in_stack_fffffffffffffc60;
  allocator<char> *actual_expression;
  char *in_stack_fffffffffffffc68;
  int line;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  undefined8 in_stack_fffffffffffffc78;
  Type TVar4;
  allocator<char> *in_stack_fffffffffffffc80;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Message *in_stack_fffffffffffffcc8;
  AssertHelper *in_stack_fffffffffffffcd0;
  allocator<char> local_321;
  string local_320 [88];
  string local_2c8 [32];
  AssertionResult local_2a8 [2];
  allocator<char> local_281;
  string local_280 [88];
  string local_228 [32];
  AssertionResult local_208 [2];
  undefined1 local_1e1 [41];
  big_integer *in_stack_fffffffffffffe48;
  string local_188 [32];
  AssertionResult local_168 [2];
  allocator<char> local_141;
  string local_140 [88];
  string local_e8 [32];
  AssertionResult local_c8 [2];
  string *in_stack_ffffffffffffff58;
  big_integer *in_stack_ffffffffffffff60;
  allocator<char> local_91;
  string local_90 [88];
  string local_38 [32];
  AssertionResult local_18;
  
  TVar4 = (Type)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,
             (char *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
             in_stack_fffffffffffffc80);
  big_integer::big_integer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  to_string_abi_cxx11_(in_stack_fffffffffffffe48);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[4]>
            (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
             &in_stack_fffffffffffffc50->sign);
  std::__cxx11::string::~string(local_38);
  big_integer::~big_integer(in_stack_fffffffffffffc50);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc80);
    testing::AssertionResult::failure_message((AssertionResult *)0x1235a3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffc80,TVar4,
               (char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc50);
    testing::Message::~Message((Message *)0x123600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x123658);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,
             (char *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
             in_stack_fffffffffffffc80);
  big_integer::big_integer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  to_string_abi_cxx11_(in_stack_fffffffffffffe48);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[4]>
            (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
             &in_stack_fffffffffffffc50->sign);
  std::__cxx11::string::~string(local_e8);
  big_integer::~big_integer(in_stack_fffffffffffffc50);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc80);
    testing::AssertionResult::failure_message((AssertionResult *)0x12380e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffc80,TVar4,
               (char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc50);
    testing::Message::~Message((Message *)0x12386b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1238c3);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
             in_stack_fffffffffffffc80);
  big_integer::big_integer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  to_string_abi_cxx11_(in_stack_fffffffffffffe48);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[2]>
            (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
             &in_stack_fffffffffffffc50->sign);
  std::__cxx11::string::~string(local_188);
  big_integer::~big_integer(in_stack_fffffffffffffc50);
  std::__cxx11::string::~string((string *)(local_1e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1e1);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_168);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc80);
    in_stack_fffffffffffffc80 =
         (allocator<char> *)testing::AssertionResult::failure_message((AssertionResult *)0x123a79);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffc80,TVar4,
               (char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc50);
    testing::Message::~Message((Message *)0x123ad6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x123b2e);
  TVar4 = (Type)((ulong)&local_281 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)CONCAT17(uVar2,in_stack_fffffffffffffc88),in_stack_fffffffffffffc80);
  big_integer::big_integer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  to_string_abi_cxx11_(in_stack_fffffffffffffe48);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[2]>
            (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
             &in_stack_fffffffffffffc50->sign);
  std::__cxx11::string::~string(local_228);
  big_integer::~big_integer(in_stack_fffffffffffffc50);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator(&local_281);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_208);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc80);
    in_stack_fffffffffffffc68 =
         testing::AssertionResult::failure_message((AssertionResult *)0x123ce4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffc80,TVar4,
               (char *)CONCAT17(uVar3,in_stack_fffffffffffffc70),
               (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc50);
    testing::Message::~Message((Message *)0x123d41);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x123d99);
  actual_expression = &local_321;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)CONCAT17(uVar2,in_stack_fffffffffffffc88),in_stack_fffffffffffffc80);
  big_integer::big_integer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  to_string_abi_cxx11_(in_stack_fffffffffffffe48);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[18]>
            (in_stack_fffffffffffffc68,(char *)actual_expression,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
             &in_stack_fffffffffffffc50->sign);
  line = (int)((ulong)in_stack_fffffffffffffc68 >> 0x20);
  std::__cxx11::string::~string(local_2c8);
  big_integer::~big_integer(in_stack_fffffffffffffc50);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator(&local_321);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc80);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x123f4f)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffc80,TVar4,
               (char *)CONCAT17(uVar3,in_stack_fffffffffffffc70),line,(char *)actual_expression);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x123fac);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x124001);
  return;
}

Assistant:

TEST(correctness, string_conv)
{
    EXPECT_EQ(to_string(big_integer("100")), "100");
    EXPECT_EQ(to_string(big_integer("0100")), "100");
    EXPECT_EQ(to_string(big_integer("0")), "0");
    EXPECT_EQ(to_string(big_integer("-0")), "0");
    EXPECT_EQ(to_string(big_integer("-1000000000000000")), "-1000000000000000");
}